

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cpp
# Opt level: O0

vector<FileStatus,_std::allocator<FileStatus>_> *
strStatus_abi_cxx11_(vector<FileStatus,_std::allocator<FileStatus>_> *result)

{
  size_type sVar1;
  reference pvVar2;
  ostream *this;
  vector<FileStatus,_std::allocator<FileStatus>_> *in_RSI;
  int local_1a4;
  stringstream local_1a0 [4];
  int i;
  stringstream ss;
  ostream local_190 [384];
  vector<FileStatus,_std::allocator<FileStatus>_> *result_local;
  
  result_local = result;
  std::__cxx11::stringstream::stringstream(local_1a0);
  for (local_1a4 = 0; sVar1 = std::vector<FileStatus,_std::allocator<FileStatus>_>::size(in_RSI),
      (ulong)(long)local_1a4 < sVar1; local_1a4 = local_1a4 + 1) {
    pvVar2 = std::vector<FileStatus,_std::allocator<FileStatus>_>::operator[]
                       (in_RSI,(long)local_1a4);
    switch(pvVar2->status) {
    case added:
      std::operator<<(local_190,"A ");
      break;
    case removed:
      std::operator<<(local_190,"R ");
      break;
    case modified:
      std::operator<<(local_190,"M ");
      break;
    case none:
    }
    pvVar2 = std::vector<FileStatus,_std::allocator<FileStatus>_>::operator[]
                       (in_RSI,(long)local_1a4);
    this = std::operator<<(local_190,(string *)pvVar2);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return result;
}

Assistant:

String strStatus(Vector<FileStatus> result){
    std::stringstream ss;
    for(int i = 0; i < result.size();i++){
        switch(result[i].status){
            case added:
                ss << "A ";
                break;
            case removed:
                ss << "R ";
                break;
            case modified:
                ss << "M ";
                break;
            case none:break;
        }
        ss << result[i].filename << Endl;
    }
    return ss.str();
}